

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void basic_suite::test_null(void)

{
  char input [5];
  decoder_type decoder;
  undefined4 local_170;
  value local_16c;
  value_type local_168 [8];
  basic_decoder<char> local_160;
  
  local_160.input.tail = local_168 + 4;
  builtin_memcpy(local_168,"null",5);
  local_160.input.head = local_168;
  memset(&local_160.current,0,0x120);
  local_160.current.code = uninitialized;
  local_160.current.view.head = (const_pointer)0x0;
  local_160.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_160);
  local_16c = local_160.current.code;
  local_170 = 5;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xd9,"void basic_suite::test_null()",&local_16c,&local_170);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[5]>
            ("decoder.literal()","\"null\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xda,"void basic_suite::test_null()",&local_160.current.view,"null");
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[1]>
            ("decoder.tail()","\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xdb,"void basic_suite::test_null()",&local_160,"");
  if (error_unexpected_token < local_160.current.code) {
    if (local_160.current.code == end) {
      local_160.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_160);
    }
  }
  local_16c = local_160.current.code;
  local_170 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xdd,"void basic_suite::test_null()",&local_16c,&local_170);
  return;
}

Assistant:

void test_null()
{
    const char input[] = "null";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::null);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "null");
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.tail(), "");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}